

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_8060 [8];
  TcpListener tl;
  undefined1 local_8030 [8];
  Poller po;
  
  po.buffPool.objs_._M_elems[0xfff]._4_4_ = 0;
  Poller::Poller((Poller *)local_8030);
  Poller::Init((Poller *)local_8030,0x400,10);
  TcpListener::TcpListener((TcpListener *)local_8060);
  TcpListener::Listen((TcpListener *)local_8060,0x22b0);
  Poller::Add((Poller *)local_8030,(PollObj *)local_8060,0x11);
  do {
    Poller::Process((Poller *)local_8030);
  } while( true );
}

Assistant:

int main() {
    Poller po;
    po.Init(1024, 10);
    TcpListener tl;
    tl.Listen(8880);
    po.Add(&tl, EV_READ|EV_ET);
    while (true)
    {
        po.Process();
    }
    


    return 0;
}